

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Witness_complex.h
# Opt level: O0

bool __thiscall
Gudhi::witness_complex::
Witness_complex<std::vector<std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>,std::allocator<std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>>>
::create_complex<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>
          (Witness_complex<std::vector<std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>,std::allocator<std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>>>
           *this,Simplex_tree<Gudhi::Simplex_tree_options_default> *complex,double max_alpha_square,
          size_t limit_dimension)

{
  iterator curr_l;
  iterator end;
  bool bVar1;
  size_t sVar2;
  reference __args;
  pointer pAVar3;
  double norelax_dist2;
  iterator local_f0;
  const_iterator local_e8;
  iterator local_e0;
  iterator local_c8;
  byte local_a9;
  iterator iStack_a8;
  bool ok;
  undefined1 local_a0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> simplex;
  iterator aw_it;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_> *w;
  const_iterator __end0;
  const_iterator __begin0;
  Nearest_landmark_table_internal *__range3;
  Landmark_id k;
  ActiveWitnessList active_witnesses;
  size_t limit_dimension_local;
  double max_alpha_square_local;
  Simplex_tree<Gudhi::Simplex_tree_options_default> *complex_local;
  Witness_complex<std::vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
  *this_local;
  
  active_witnesses.
  super__List_base<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
  ._M_impl._M_node._M_size = limit_dimension;
  sVar2 = Simplex_tree<Gudhi::Simplex_tree_options_default>::num_vertices(complex);
  if (sVar2 == 0) {
    if (0.0 <= max_alpha_square) {
      std::__cxx11::
      list<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
      ::list((list<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
              *)&k);
      __range3 = (Nearest_landmark_table_internal *)0x0;
      __end0 = std::
               vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
               ::begin((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                        *)this);
      w = (vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
           *)std::
             vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
             ::end((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                    *)this);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end0,(__normal_iterator<const_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_*,_std::vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
                                         *)&w), bVar1) {
        __args = __gnu_cxx::
                 __normal_iterator<const_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_*,_std::vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
                 ::operator*(&__end0);
        std::__cxx11::
        list<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,double>,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,double>,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>>>
        ::
        emplace_back<std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>const&>
                  ((list<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,double>,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,double>,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>>>
                    *)&k,__args);
        __gnu_cxx::
        __normal_iterator<const_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_*,_std::vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
        ::operator++(&__end0);
      }
      for (; bVar1 = std::__cxx11::
                     list<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
                     ::empty((list<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
                              *)&k),
          !bVar1 && __range3 <=
                    active_witnesses.
                    super__List_base<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
                    ._M_impl._M_node._M_size;
          __range3 = (Nearest_landmark_table_internal *)
                     ((long)&(__range3->
                             super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1)) {
        simplex.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::__cxx11::
                      list<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
                      ::begin((list<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
                               *)&k);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a0);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a0,
                   (size_type)
                   ((long)&(__range3->
                           super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1));
        while( true ) {
          iStack_a8 = std::__cxx11::
                      list<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
                      ::end((list<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
                             *)&k);
          bVar1 = std::operator!=((_Self *)&simplex.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  &stack0xffffffffffffff58);
          if (!bVar1) break;
          norelax_dist2 = std::numeric_limits<double>::infinity();
          pAVar3 = std::
                   _List_iterator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                   ::operator->((_List_iterator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                 *)&simplex.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
          Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
          ::begin(&local_c8,pAVar3);
          pAVar3 = std::
                   _List_iterator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                   ::operator->((_List_iterator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                 *)&simplex.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
          Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
          ::end(&local_e0,pAVar3);
          curr_l.lh_._M_node = local_c8.lh_._M_node;
          curr_l.aw_ = local_c8.aw_;
          curr_l.is_end_ = local_c8.is_end_;
          curr_l._17_7_ = local_c8._17_7_;
          end.lh_._M_node = local_e0.lh_._M_node;
          end.aw_ = local_e0.aw_;
          end.is_end_ = local_e0.is_end_;
          end._17_7_ = local_e0._17_7_;
          local_a9 = add_all_faces_of_dimension<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>
                               (this,(int)__range3,max_alpha_square,norelax_dist2,curr_l,
                                (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a0,
                                complex,end);
          bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a0);
          if (!bVar1) {
            __assert_fail("simplex.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Witness_complex/include/gudhi/Witness_complex.h"
                          ,0x74,
                          "bool Gudhi::witness_complex::Witness_complex<std::vector<std::vector<std::pair<unsigned long, double>>>>::create_complex(SimplicialComplexForWitness &, double, std::size_t) const [Nearest_landmark_table_ = std::vector<std::vector<std::pair<unsigned long, double>>>, SimplicialComplexForWitness = Gudhi::Simplex_tree<>]"
                         );
          }
          if ((local_a9 & 1) == 0) {
            local_f0._M_node =
                 (_List_node_base *)
                 std::
                 _List_iterator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                 ::operator++((_List_iterator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                               *)&simplex.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,0);
            std::
            _List_const_iterator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
            ::_List_const_iterator(&local_e8,&local_f0);
            std::__cxx11::
            list<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
            ::erase((list<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
                     *)&k,local_e8);
          }
          else {
            std::
            _List_iterator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
            ::operator++((_List_iterator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                          *)&simplex.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,0);
          }
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a0);
      }
      this_local._7_1_ = true;
      std::__cxx11::
      list<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
      ::~list((list<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
               *)&k);
    }
    else {
      std::operator<<((ostream *)&std::cerr,
                      "Witness complex cannot create complex - squared relaxation parameter must be non-negative.\n"
                     );
      this_local._7_1_ = false;
    }
  }
  else {
    std::operator<<((ostream *)&std::cerr,
                    "Witness complex cannot create complex - complex is not empty.\n");
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool create_complex(SimplicialComplexForWitness& complex,
                      double  max_alpha_square,
                      std::size_t limit_dimension = std::numeric_limits<std::size_t>::max()) const {
    if (complex.num_vertices() > 0) {
      std::cerr << "Witness complex cannot create complex - complex is not empty.\n";
      return false;
    }
    if (max_alpha_square < 0) {
      std::cerr << "Witness complex cannot create complex - squared relaxation parameter must be non-negative.\n";
      return false;
    }
    ActiveWitnessList active_witnesses;
    Landmark_id k = 0; /* current dimension in iterative construction */
    for (auto&& w : nearest_landmark_table_)
      active_witnesses.emplace_back(w);
    while (!active_witnesses.empty() && k <= limit_dimension) {
      typename ActiveWitnessList::iterator aw_it = active_witnesses.begin();
      std::vector<Landmark_id> simplex;
      simplex.reserve(k+1);
      while (aw_it != active_witnesses.end()) {
        bool ok = add_all_faces_of_dimension(k,
                                             max_alpha_square,
                                             std::numeric_limits<double>::infinity(),
                                             aw_it->begin(),
                                             simplex,
                                             complex,
                                             aw_it->end());
        assert(simplex.empty());
        if (!ok)
          active_witnesses.erase(aw_it++);  // First increase the iterator and then erase the previous element
        else
          aw_it++;
      }
      k++;
    }
    return true;
  }